

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

cgltf_size cgltf_calc_size(cgltf_type type,cgltf_component_type component_type)

{
  cgltf_size cVar1;
  cgltf_size component_size;
  cgltf_component_type component_type_local;
  cgltf_type type_local;
  
  _component_type_local = cgltf_component_size(component_type);
  if ((type == cgltf_type_mat2) && (_component_type_local == 1)) {
    _component_type_local = 8;
  }
  else if ((type == cgltf_type_mat3) &&
          ((_component_type_local == 1 || (_component_type_local == 2)))) {
    _component_type_local = _component_type_local * 0xc;
  }
  else {
    cVar1 = cgltf_num_components(type);
    _component_type_local = _component_type_local * cVar1;
  }
  return _component_type_local;
}

Assistant:

static cgltf_size cgltf_calc_size(cgltf_type type, cgltf_component_type component_type)
{
	cgltf_size component_size = cgltf_component_size(component_type);
	if (type == cgltf_type_mat2 && component_size == 1)
	{
		return 8 * component_size;
	}
	else if (type == cgltf_type_mat3 && (component_size == 1 || component_size == 2))
	{
		return 12 * component_size;
	}
	return component_size * cgltf_num_components(type);
}